

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestProto3Optional::_InternalSerialize
          (TestProto3Optional *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestProto3Optional_NestedMessage *pTVar1;
  TestProto3Optional *pTVar2;
  bool bVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  TestProto3Optional_NestedEnum value;
  uint32_t *puVar8;
  int64_t iVar9;
  uint64_t uVar10;
  WireFormatLite *pWVar11;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  float value_00;
  double value_01;
  string_view sVar12;
  string_view field_name;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string *local_78;
  string *_s_2;
  char *local_68;
  string *local_60;
  string *_s_1;
  char *local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string *local_38;
  string *_s;
  TestProto3Optional *pTStack_28;
  uint32_t cached_has_bits;
  TestProto3Optional *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestProto3Optional *this_local;
  
  _s._4_4_ = 0;
  pTStack_28 = this;
  this_ = (TestProto3Optional *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar8 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  pTVar2 = this_;
  _s._4_4_ = *puVar8;
  if ((_s._4_4_ & 0x40) != 0) {
    iVar4 = _internal_optional_int32(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             ((EpsCopyOutputStream *)pTVar2,iVar4,(uint8_t *)stream_local);
  }
  pTVar2 = this_;
  if ((_s._4_4_ & 0x20) != 0) {
    iVar9 = _internal_optional_int64(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<2>
                             ((EpsCopyOutputStream *)pTVar2,iVar9,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x80) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    uVar5 = _internal_optional_uint32(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                             (3,uVar5,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x100) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    uVar10 = _internal_optional_uint64(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt64ToArray
                             (4,uVar10,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x400) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    iVar4 = _internal_optional_sint32(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteSInt32ToArray
                             (5,iVar4,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x200) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    iVar9 = _internal_optional_sint64(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteSInt64ToArray
                             (6,iVar9,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x800) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    uVar5 = _internal_optional_fixed32(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteFixed32ToArray
                             (7,uVar5,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x1000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    uVar10 = _internal_optional_fixed64(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteFixed64ToArray
                             (8,uVar10,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x4000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    iVar4 = _internal_optional_sfixed32(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteSFixed32ToArray
                             (9,iVar4,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x2000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    iVar9 = _internal_optional_sfixed64(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteSFixed64ToArray
                             (10,iVar9,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x8000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_00 = _internal_optional_float(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteFloatToArray
                             (0xb,value_00,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x10000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_01 = _internal_optional_double(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray
                             (0xc,value_01,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x20000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar3 = _internal_optional_bool(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteBoolToArray
                             (0xd,bVar3,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_optional_string_abi_cxx11_(pTStack_28);
    pWVar11 = (WireFormatLite *)std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"proto2_unittest.TestProto3Optional.optional_string");
    sVar12._M_str = in_R9;
    sVar12._M_len = (size_t)local_48._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar11,(char *)(ulong)uVar6,1,(Operation)local_48._M_len,sVar12);
    pTVar2 = this_;
    sVar12 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    local_50 = sVar12._M_str;
    _s_1 = (string *)sVar12._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar2,0xe,sVar12,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    local_60 = _internal_optional_bytes_abi_cxx11_(pTStack_28);
    pTVar2 = this_;
    sVar12 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_68 = sVar12._M_str;
    _s_2 = (string *)sVar12._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteBytesMaybeAliased
                             ((EpsCopyOutputStream *)pTVar2,0xf,sVar12,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 4) != 0) {
    local_78 = _internal_optional_cord_abi_cxx11_(pTStack_28);
    pWVar11 = (WireFormatLite *)std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,"proto2_unittest.TestProto3Optional.optional_cord");
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)local_88._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar11,(char *)(ulong)uVar6,1,(Operation)local_88._M_len,field_name);
    pTVar2 = this_;
    sVar12 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar2,0x10,sVar12,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 8) != 0) {
    pTVar1 = (pTStack_28->field_0)._impl_.optional_nested_message_;
    iVar7 = TestProto3Optional_NestedMessage::GetCachedSize
                      ((pTStack_28->field_0)._impl_.optional_nested_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x12,(MessageLite *)pTVar1,iVar7,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 0x10) != 0) {
    pTVar1 = (pTStack_28->field_0)._impl_.lazy_nested_message_;
    iVar7 = TestProto3Optional_NestedMessage::GetCachedSize
                      ((pTStack_28->field_0)._impl_.lazy_nested_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x13,(MessageLite *)pTVar1,iVar7,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 0x40000) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value = _internal_optional_nested_enum(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (0x15,value,(uint8_t *)stream_local);
  }
  if (((_s._4_4_ & 0x100000) != 0) && (iVar4 = _internal_singular_int32(pTStack_28), iVar4 != 0)) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    iVar4 = _internal_singular_int32(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                             (0x16,iVar4,(uint8_t *)stream_local);
  }
  if (((_s._4_4_ & 0x80000) != 0) && (iVar9 = _internal_singular_int64(pTStack_28), iVar9 != 0)) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    iVar9 = _internal_singular_int64(pTStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt64ToArray
                             (0x17,iVar9,(uint8_t *)stream_local);
  }
  bVar3 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(pTStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar3) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pTStack_28->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestProto3Optional::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestProto3Optional& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestProto3Optional)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 optional_int32 = 1;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_optional_int32(), target);
  }

  // optional int64 optional_int64 = 2;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<2>(
            stream, this_._internal_optional_int64(), target);
  }

  // optional uint32 optional_uint32 = 3;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        3, this_._internal_optional_uint32(), target);
  }

  // optional uint64 optional_uint64 = 4;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        4, this_._internal_optional_uint64(), target);
  }

  // optional sint32 optional_sint32 = 5;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt32ToArray(
        5, this_._internal_optional_sint32(), target);
  }

  // optional sint64 optional_sint64 = 6;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt64ToArray(
        6, this_._internal_optional_sint64(), target);
  }

  // optional fixed32 optional_fixed32 = 7;
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        7, this_._internal_optional_fixed32(), target);
  }

  // optional fixed64 optional_fixed64 = 8;
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed64ToArray(
        8, this_._internal_optional_fixed64(), target);
  }

  // optional sfixed32 optional_sfixed32 = 9;
  if ((cached_has_bits & 0x00004000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed32ToArray(
        9, this_._internal_optional_sfixed32(), target);
  }

  // optional sfixed64 optional_sfixed64 = 10;
  if ((cached_has_bits & 0x00002000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed64ToArray(
        10, this_._internal_optional_sfixed64(), target);
  }

  // optional float optional_float = 11;
  if ((cached_has_bits & 0x00008000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        11, this_._internal_optional_float(), target);
  }

  // optional double optional_double = 12;
  if ((cached_has_bits & 0x00010000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        12, this_._internal_optional_double(), target);
  }

  // optional bool optional_bool = 13;
  if ((cached_has_bits & 0x00020000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        13, this_._internal_optional_bool(), target);
  }

  // optional string optional_string = 14;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_optional_string();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto2_unittest.TestProto3Optional.optional_string");
    target = stream->WriteStringMaybeAliased(14, _s, target);
  }

  // optional bytes optional_bytes = 15;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_optional_bytes();
    target = stream->WriteBytesMaybeAliased(15, _s, target);
  }

  // optional string optional_cord = 16 [ctype = CORD];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_optional_cord();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto2_unittest.TestProto3Optional.optional_cord");
    target = stream->WriteStringMaybeAliased(16, _s, target);
  }

  // optional .proto2_unittest.TestProto3Optional.NestedMessage optional_nested_message = 18;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        18, *this_._impl_.optional_nested_message_, this_._impl_.optional_nested_message_->GetCachedSize(), target,
        stream);
  }

  // optional .proto2_unittest.TestProto3Optional.NestedMessage lazy_nested_message = 19 [lazy = true];
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        19, *this_._impl_.lazy_nested_message_, this_._impl_.lazy_nested_message_->GetCachedSize(), target,
        stream);
  }

  // optional .proto2_unittest.TestProto3Optional.NestedEnum optional_nested_enum = 21;
  if ((cached_has_bits & 0x00040000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        21, this_._internal_optional_nested_enum(), target);
  }

  // int32 singular_int32 = 22;
  if ((cached_has_bits & 0x00100000u) != 0) {
    if (this_._internal_singular_int32() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteInt32ToArray(
          22, this_._internal_singular_int32(), target);
    }
  }

  // int64 singular_int64 = 23;
  if ((cached_has_bits & 0x00080000u) != 0) {
    if (this_._internal_singular_int64() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteInt64ToArray(
          23, this_._internal_singular_int64(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestProto3Optional)
  return target;
}